

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O1

int graph_5_4::prim_1(m_graph g)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uStack_30;
  int iStack_28;
  undefined1 auStack_24 [4];
  
  iVar5 = g.vexs[8];
  uVar10 = (ulong)(uint)g.vexs[8];
  uVar7 = uVar10 * 4 + 0xf & 0xfffffffffffffff0;
  lVar3 = -uVar7;
  lVar4 = lVar3 + -0x28;
  *(undefined4 *)((long)&iStack_28 - uVar7) = 0;
  if (1 < g.vexs[8]) {
    *(undefined8 *)((long)&uStack_30 + lVar3) = 0x103c5f;
    memcpy(auStack_24 + lVar3,&stack0x0000000c,(ulong)(g.vexs[8] - 1) << 2);
  }
  do {
    do {
    } while (iVar5 < 2);
    uVar7 = 0;
    iVar6 = -1;
    uVar8 = 1;
    do {
      iVar1 = *(int *)((long)&iStack_28 + uVar8 * 4 + lVar4 + 0x28);
      if (iVar1 != 0 && iVar1 < iVar6) {
        iVar6 = iVar1;
        uVar7 = uVar8 & 0xffffffff;
      }
      *(undefined4 *)((long)&iStack_28 + (long)(int)uVar7 * 4 + lVar4 + 0x28) = 0;
      uVar9 = 1;
      do {
        iVar1 = *(int *)((long)&iStack_28 + uVar9 * 4 + lVar4 + 0x28);
        if ((iVar1 != 0) && (iVar2 = g.arc[(long)(int)uVar7 + -1][uVar9 + 8], iVar2 < iVar1)) {
          *(int *)((long)&iStack_28 + uVar9 * 4 + lVar4 + 0x28) = iVar2;
        }
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar10);
  } while( true );
}

Assistant:

int prim_1(m_graph g) {
        int adjvex[g.vnum], dis[g.vnum], min, j, k;
        adjvex[0] = 0;
        dis[0] = 0;
        for (int i = 1; i < g.vnum; i++) {
            dis[i] = g.arc[0][i];
            adjvex[i] = 0;
        }
        for (int i = 0; i < g.vnum; i++) {
            min = INTMAX_MAX, j = 1, k = 0;
            while (j < g.vnum) {
                if (dis[j] != 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
                j++;
                //visit (k);
                dis[k] = 0;
                for (int p = 1; p < g.vnum; p++) {
                    if (dis[p] != 0 && g.arc[k][p] < dis[p]) {
                        dis[p] = g.arc[k][p];
                        adjvex[p] = k;
                    }
                }
            }
        }
    }